

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_config.c
# Opt level: O3

int mpt_parse_config(mpt_input_parser_t next,void *npar,mpt_parser_context *parse,
                    mpt_path_handler_t save,void *ctx)

{
  uint uVar1;
  int iVar2;
  mpt_value *pmVar3;
  mpt_path path;
  mpt_value val;
  iovec vec;
  mpt_path local_78;
  mpt_value local_50;
  char *local_40;
  ulong local_38;
  
  local_78.len = 0;
  local_78.first = '\0';
  local_78.flags = '\0';
  local_78.sep = '.';
  local_78.assign = '\0';
  local_78._28_4_ = 0;
  local_78.base = (char *)0x0;
  local_78.off = 0;
  local_50._addr = &local_40;
  local_50._type = 0x43;
  uVar1 = (*next)(npar,parse,&local_78);
  if (0 < (int)uVar1) {
    do {
      local_40 = local_78.base + local_78.len + local_78.off;
      local_38 = (ulong)parse->valid;
      if ((uVar1 & 4) == 0) {
        pmVar3 = (mpt_value *)0x0;
      }
      else {
        pmVar3 = &local_50;
      }
      iVar2 = (*save)(ctx,&local_78,pmVar3,(uint)parse->prev,uVar1);
      if (iVar2 < 0) {
        uVar1 = 0xffffff80;
        break;
      }
      if ((uVar1 & 2) == 0) {
        iVar2 = mpt_path_invalidate(&local_78);
      }
      else {
        iVar2 = mpt_path_del(&local_78);
      }
      if (iVar2 < 0) {
        uVar1 = 0xfffffff0;
        break;
      }
      parse->prev = parse->curr;
      parse->curr = '\0';
      parse->valid = 0;
      uVar1 = (*next)(npar,parse,&local_78);
    } while (0 < (int)uVar1);
  }
  mpt_path_fini(&local_78);
  return uVar1;
}

Assistant:

extern int mpt_parse_config(MPT_TYPE(input_parser) next, void *npar, MPT_STRUCT(parser_context) *parse, MPT_TYPE(path_handler) save, void *ctx)
{
	MPT_STRUCT(path) path = MPT_PATH_INIT;
	struct iovec vec;
	MPT_STRUCT(value) val = MPT_VALUE_INIT(MPT_type_toVector('c'), &vec);
	int ret;
	
	/* accuire next path element */
	while ((ret = next(npar, parse, &path)) > 0) {
		vec.iov_base = (char *) (path.base + path.off + path.len);
		vec.iov_len  = parse->valid;
		
		/* save to configuration */
		if (save(ctx, &path, ret & MPT_PARSEFLAG(Data) ? &val : 0, parse->prev, ret) < 0) {
			ret = -0x80;
			break;
		}
		/* remove last path element or trailing data */
		if (ret & MPT_PARSEFLAG(SectEnd)) {
			ret = mpt_path_del(&path);
		} else {
			ret = mpt_path_invalidate(&path);
		}
		if (ret < 0) {
			ret = MPT_ERROR(MissingData);
			break;
		}
		/* cycle parse state */
		parse->prev = parse->curr;
		parse->curr = 0;
		
		/* reset valid post path size */
		parse->valid = 0;
	}
	mpt_path_fini(&path);
	
	return ret;
}